

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O2

void xatlas::internal::TaskScheduler::workerThread
               (TaskScheduler *scheduler,Worker *worker,uint32_t threadIndex)

{
  atomic<bool> *paVar1;
  uint index;
  TaskGroup *pTVar2;
  uint32_t *puVar3;
  Task *pTVar4;
  long lVar5;
  uint32_t i;
  ulong uVar6;
  unique_lock<std::mutex> lock;
  
  puVar3 = (uint32_t *)__tls_get_addr(&PTR_0013bfc0);
  *puVar3 = threadIndex;
  std::unique_lock<std::mutex>::unique_lock(&lock,&worker->mutex);
LAB_0011af58:
  std::condition_variable::
  wait<xatlas::internal::TaskScheduler::workerThread(xatlas::internal::TaskScheduler*,xatlas::internal::TaskScheduler::Worker*,unsigned_int)::_lambda()_1_>
            (&worker->cv,&lock,(anon_class_8_1_728644bc)worker);
  LOCK();
  (worker->wakeup)._M_base._M_i = false;
  UNLOCK();
LAB_0011af6e:
  if (((scheduler->m_shutdown)._M_base._M_i & 1U) != 0) {
    std::unique_lock<std::mutex>::~unique_lock(&lock);
    return;
  }
  lVar5 = 0x24;
  uVar6 = 0;
  do {
    if (scheduler->m_maxGroups <= uVar6) goto LAB_0011af58;
    pTVar2 = scheduler->m_groups;
    if (((*(byte *)((long)pTVar2 + lVar5 + -0x24) & 1) == 0) &&
       (*(int *)(&pTVar2->field_0x4 + lVar5) != 0)) {
      Spinlock::lock((Spinlock *)(&pTVar2->free + lVar5));
      index = *(uint *)((long)pTVar2 + lVar5 + -4);
      if (index < *(uint *)((long)pTVar2 + lVar5 + -0x10)) break;
      ((__atomic_flag_base *)&(&pTVar2->free)[lVar5]._M_base._M_i)->_M_i = false;
    }
    uVar6 = uVar6 + 1;
    lVar5 = lVar5 + 0x38;
  } while( true );
  paVar1 = &pTVar2->free + lVar5;
  *(uint *)(paVar1 + -4) = index + 1;
  pTVar4 = Array<xatlas::internal::Task>::operator[]
                     ((Array<xatlas::internal::Task> *)(paVar1 + -0x1c),index);
  (paVar1->_M_base)._M_i = false;
  (*pTVar4->func)(*(void **)(paVar1 + 0xc),pTVar4->userData);
  LOCK();
  *(int *)(&pTVar2->field_0x4 + lVar5) = *(int *)(&pTVar2->field_0x4 + lVar5) + -1;
  UNLOCK();
  goto LAB_0011af6e;
}

Assistant:

static void workerThread(TaskScheduler *scheduler, Worker *worker, uint32_t threadIndex)
	{
		m_threadIndex = threadIndex;
		std::unique_lock<std::mutex> lock(worker->mutex);
		for (;;) {
			worker->cv.wait(lock, [=]{ return worker->wakeup.load(); });
			worker->wakeup = false;
			for (;;) {
				if (scheduler->m_shutdown)
					return;
				// Look for a task in any of the groups and run it.
				TaskGroup *group = nullptr;
				Task *task = nullptr;
				for (uint32_t i = 0; i < scheduler->m_maxGroups; i++) {
					group = &scheduler->m_groups[i];
					if (group->free || group->ref == 0)
						continue;
					group->queueLock.lock();
					if (group->queueHead < group->queue.size()) {
						task = &group->queue[group->queueHead++];
						group->queueLock.unlock();
						break;
					}
					group->queueLock.unlock();
				}
				if (!task)
					break;
				task->func(group->userData, task->userData);
				group->ref--;
			}
		}
	}